

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O1

void __thiscall
Diligent::anon_unknown_77::BindResourceHelper::operator()
          (BindResourceHelper *this,BindResourceInfo *BindInfo)

{
  DescriptorType DVar1;
  Resource *pRVar2;
  PipelineResourceDesc *Args_6;
  Uint64 UVar3;
  IDeviceObject *pIVar4;
  ShaderResourceCacheVk *pSVar5;
  RefCntAutoPtr<Diligent::BufferViewVkImpl> RVar6;
  RefCntAutoPtr<Diligent::TextureViewVkImpl> RVar7;
  byte bVar8;
  undefined1 uVar9;
  bool bVar10;
  PipelineResourceDesc *Args;
  PipelineResourceAttribsType *pPVar11;
  RenderDeviceVkImpl *pRVar12;
  char (*in_RCX) [36];
  char *pViewImpl;
  BufferViewVkImpl *pBVar13;
  TextureViewVkImpl *pViewImpl_00;
  string *this_00;
  Uint32 UVar14;
  char *in_R8;
  RefCntAutoPtr<Diligent::BufferViewVkImpl> *Args_2;
  Uint64 UVar15;
  char (*in_R9) [205];
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes;
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes_00;
  char *in_stack_ffffffffffffff50;
  char (*in_stack_ffffffffffffff58) [38];
  string msg;
  RefCntAutoPtr<Diligent::BufferViewVkImpl> pBufferViewVk;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_39;
  RefCntAutoPtr<Diligent::TextureViewVkImpl> pTexViewVk0;
  
  if (this->m_ArrayIndex != BindInfo->ArrayIndex) {
    FormatString<char[26],char[36]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_ArrayIndex == BindInfo.ArrayIndex",in_RCX);
    in_stack_ffffffffffffff50 = (char *)0x252c54;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x141);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      in_stack_ffffffffffffff50 = (char *)0x252c6f;
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pRVar2 = this->m_DstRes;
  if (BindInfo->pObject == (IDeviceObject *)0x0) {
    if ((((pRVar2->pObject).m_pObject != (IDeviceObject *)0x0) &&
        (this->m_ResDesc->VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) &&
       ((BindInfo->Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) ==
        SET_SHADER_RESOURCE_FLAG_NONE)) {
      FormatString<char[18],char_const*,char[100],char[205]>
                (&msg,(Diligent *)"Shader variable \'",(char (*) [18])this->m_ResDesc,
                 (char **)
                 "\' is not dynamic, but is being reset to null. This is an error and may cause unpredicted behavior. "
                 ,(char (*) [100])
                  "If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise, use another shader resource binding instance or label the variable as dynamic."
                 ,in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    ShaderResourceCacheVk::ResetResource
              (this->m_ResourceCache,(uint)((ulong)*(undefined8 *)this->m_Attribs >> 0x3e) & 1,
               this->m_DstResCacheOffset);
    return;
  }
  DVar1 = pRVar2->Type;
  switch(DVar1) {
  case Sampler:
    if (-1 < *(long *)this->m_Attribs) {
      if (this->m_DstRes->Type != Sampler) {
        FormatString<char[38]>(&msg,(char (*) [38])"Separate sampler resource is expected");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CacheSeparateSampler",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                   ,0x244);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(long *)this->m_Attribs < 0) {
        FormatString<char[55]>
                  (&msg,(char (*) [55])"This separate sampler is assigned an immutable sampler");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CacheSeparateSampler",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                   ,0x245);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      pIVar4 = BindInfo->pObject;
      pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
      if (pIVar4 != (IDeviceObject *)0x0) {
        (**(pIVar4->super_IObject)._vptr_IObject)(pIVar4,IID_Sampler,&pBufferViewVk);
      }
      VerifySamplerBinding<Diligent::SamplerVkImpl>
                (this->m_ResDesc,BindInfo,(SamplerVkImpl *)pBufferViewVk.m_pObject,
                 (this->m_DstRes->pObject).m_pObject,
                 (this->m_Signature->
                 super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                 .m_Desc.super_DeviceObjectAttribs.Name);
      RVar6 = pBufferViewVk;
      if (pBufferViewVk.m_pObject != (BufferViewVkImpl *)0x0) {
        pRVar2 = this->m_DstRes;
        if ((((pRVar2->pObject).m_pObject == (IDeviceObject *)0x0) ||
            ((BindInfo->Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) !=
             SET_SHADER_RESOURCE_FLAG_NONE)) ||
           (this->m_ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) {
          pSVar5 = this->m_ResourceCache;
          pRVar12 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                    ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                 *)this->m_Signature);
          msg._M_string_length = (size_type)pBufferViewVk;
          pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
          msg._M_dataplus._M_p._4_4_ = this->m_ArrayIndex;
          msg._M_dataplus._M_p._0_4_ = (uint)*(ushort *)this->m_Attribs;
          msg.field_2._M_allocated_capacity = 0;
          msg.field_2._8_8_ = 0;
          ShaderResourceCacheVk::SetResource
                    (pSVar5,(pRVar12->m_LogicalVkDevice).
                            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(uint)((ulong)*(undefined8 *)this->m_Attribs >> 0x3e) & 1,
                     this->m_DstResCacheOffset,(SetResourceInfo *)&msg);
          if (msg._M_string_length != 0) {
            (**(code **)(*(long *)msg._M_string_length + 0x10))();
            msg._M_string_length = 0;
          }
        }
        else {
          (**(code **)((long)((pBufferViewVk.m_pObject)->
                             super_BufferViewBase<Diligent::EngineVkImplTraits>).
                             super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                             .super_ObjectBase<Diligent::IBufferViewVk>.
                             super_RefCountedObject<Diligent::IBufferViewVk>.super_IBufferViewVk.
                             super_IBufferView.super_IDeviceObject + 8))(pBufferViewVk.m_pObject);
          pBVar13 = (BufferViewVkImpl *)(pRVar2->pObject).m_pObject;
          (**(code **)((long)((RVar6.m_pObject)->super_BufferViewBase<Diligent::EngineVkImplTraits>)
                             .
                             super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                             .super_ObjectBase<Diligent::IBufferViewVk>.
                             super_RefCountedObject<Diligent::IBufferViewVk>.super_IBufferViewVk.
                             super_IBufferView.super_IDeviceObject + 0x10))(RVar6.m_pObject);
          if (pBVar13 != RVar6.m_pObject) {
            FormatString<char[64]>
                      (&msg,(char (*) [64])
                            "Binding another object to a non-dynamic variable is not allowed");
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"UpdateCachedResource",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                       ,0x192);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      RefCntAutoPtr<Diligent::SamplerVkImpl>::Release
                ((RefCntAutoPtr<Diligent::SamplerVkImpl> *)&pBufferViewVk);
      return;
    }
    pBufferViewVk.m_pObject._0_1_ = 0x27;
    FormatString<char[57],char_const*,char>
              (&msg,(Diligent *)"Attempting to assign a sampler to an immutable sampler \'",
               (char (*) [57])this->m_ResDesc,(char **)&pBufferViewVk,in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x169);
    break;
  case CombinedImageSampler:
  case SeparateImage:
  case StorageImage:
    if (2 < (byte)(DVar1 - CombinedImageSampler)) {
      FormatString<char[68]>
                (&msg,(char (*) [68])
                      "Storage image, separate image or sampled image resource is expected");
      in_stack_ffffffffffffff50 = (char *)0x252ea4;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CacheImage",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x1fc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        in_stack_ffffffffffffff50 = (char *)0x252ebf;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    pIVar4 = BindInfo->pObject;
    pTexViewVk0.m_pObject = (TextureViewVkImpl *)0x0;
    if (pIVar4 != (IDeviceObject *)0x0) {
      in_stack_ffffffffffffff50 = (char *)0x252ee1;
      (**(pIVar4->super_IObject)._vptr_IObject)(pIVar4,IID_TextureViewVk,&pTexViewVk0);
    }
    DVar1 = this->m_DstRes->Type;
    if (DVar1 < 0xf) {
      if ((0x6006U >> (DVar1 & 0x1f) & 1) == 0) {
        uVar9 = 5;
        if (DVar1 != StorageImage) goto LAB_002539c5;
      }
      else {
        uVar9 = 1;
      }
    }
    else {
LAB_002539c5:
      FormatString<char[45]>(&msg,(char (*) [45])"Unsupported descriptor type for texture view");
      in_stack_ffffffffffffff50 = (char *)0x2539f3;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpDescriptorTypeToTextureView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0xe2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        in_stack_ffffffffffffff50 = (char *)0x253a0e;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      uVar9 = 0;
    }
    pViewImpl = (char *)&msg;
    msg._M_dataplus._M_p._0_1_ = uVar9;
    UVar15 = 1;
    VerifyResourceViewBinding<Diligent::TextureViewVkImpl,Diligent::TEXTURE_VIEW_TYPE>
              ((Diligent *)this->m_ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)pTexViewVk0.m_pObject,(TextureViewVkImpl *)pViewImpl,
               (initializer_list<Diligent::TEXTURE_VIEW_TYPE>)ZEXT816(1),RESOURCE_DIM_UNDEFINED,
               SUB81((this->m_DstRes->pObject).m_pObject,0),
               (IDeviceObject *)
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,in_stack_ffffffffffffff50);
    RVar7 = pTexViewVk0;
    bVar10 = UpdateCachedResource<Diligent::TextureViewVkImpl>
                       (this,&pTexViewVk0,BindInfo->Flags,(Uint64)pViewImpl,UVar15);
    UVar14 = (Uint32)UVar15;
    if (bVar10) {
      if (((this->m_DstRes->Type == CombinedImageSampler) && (-1 < *(long *)this->m_Attribs)) &&
         (((RVar7.m_pObject)->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pSampler.
          m_pObject == (ISampler *)0x0)) {
        GetShaderResourcePrintName_abi_cxx11_
                  ((String *)&pBufferViewVk,(Diligent *)this->m_ResDesc->Name,
                   (char *)(ulong)this->m_ResDesc->ArraySize,this->m_ArrayIndex,UVar14);
        pViewImpl = "\' to variable \'";
        Args_2 = &pBufferViewVk;
        FormatString<char[29],char_const*,char[16],std::__cxx11::string,char[38]>
                  (&msg,(Diligent *)"Error binding texture view \'",
                   (char (*) [29])
                   &((RVar7.m_pObject)->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                    .m_Desc,(char **)"\' to variable \'",(char (*) [16])Args_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\'. No sampler is assigned to the view",in_stack_ffffffffffffff58);
        UVar14 = (Uint32)Args_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pBufferViewVk.m_pObject != &local_50) {
          operator_delete(pBufferViewVk.m_pObject,(ulong)(local_50._M_allocated_capacity + 1));
        }
        if (DebugMessageCallback != (undefined *)0x0) {
          pViewImpl = (char *)0x0;
          UVar14 = 0;
          (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if ((~*(uint *)this->m_Attribs & 0xffff0000) != 0) {
        if (this->m_DstRes->Type != SeparateImage) {
          FormatString<char[96]>
                    (&msg,(char (*) [96])
                          "Only separate images can be assigned separate samplers when using HLSL-style combined samplers."
                    );
          pViewImpl = (char *)0x21d;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CacheImage",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                     ,0x21d);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        if (*(long *)this->m_Attribs < 0) {
          FormatString<char[55]>
                    (&msg,(char (*) [55])"Separate image can\'t be assigned an immutable sampler.");
          pViewImpl = (char *)0x21e;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CacheImage",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                     ,0x21e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        Args = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                         (&this->m_Signature->
                           super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                          (uint)*(ushort *)&this->m_Attribs->field_0x2);
        pPVar11 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                            (&this->m_Signature->
                              super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                             (uint)*(ushort *)&this->m_Attribs->field_0x2);
        if (Args->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
          FormatString<char[26],char[60]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"SamplerResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER",
                     (char (*) [60])pViewImpl);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CacheImage",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                     ,0x222);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        if (-1 < *(long *)pPVar11) {
          pBVar13 = (BufferViewVkImpl *)
                    ((RVar7.m_pObject)->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                    m_pSampler.m_pObject;
          if (pBVar13 == (BufferViewVkImpl *)0x0) {
            GetShaderResourcePrintName_abi_cxx11_
                      ((String *)&pBufferViewVk,(Diligent *)this->m_ResDesc->Name,
                       (char *)(ulong)this->m_ResDesc->ArraySize,this->m_ArrayIndex,UVar14);
            local_39 = 0x27;
            FormatString<char[45],char_const*,char[31],std::__cxx11::string,char[39],char_const*,char>
                      (&msg,(Diligent *)"Failed to bind sampler to sampler variable \'",
                       (char (*) [45])Args,(char **)"\' assigned to separate image \'",
                       (char (*) [31])&pBufferViewVk,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\': no sampler is set in texture view \'",
                       (char (*) [39])
                       &((RVar7.m_pObject)->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                        .m_Desc,(char **)&local_39,*in_stack_ffffffffffffff58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pBufferViewVk.m_pObject != &local_50) {
              operator_delete(pBufferViewVk.m_pObject,(ulong)(local_50._M_allocated_capacity + 1));
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            if ((Args->ArraySize != 1) &&
               (Args_6 = this->m_ResDesc, Args->ArraySize != Args_6->ArraySize)) {
              FormatString<char[13],unsigned_int,char[33],char_const*,char[46],unsigned_int,char[31],char_const*,char[20]>
                        (&msg,(Diligent *)"Array size (",(char (*) [13])&Args->ArraySize,
                         (uint *)") of separate sampler variable \'",(char (*) [33])Args,
                         (char **)"\' must be one or the same as the array size (",
                         (char (*) [46])&Args_6->ArraySize,(uint *)") of separate image variable \'"
                         ,(char (*) [31])Args_6,(char **)"\' it is assigned to",
                         (char (*) [20])in_stack_ffffffffffffff58);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"CacheImage",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                         ,0x22d);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
            }
            UVar14 = 0;
            if (Args->ArraySize != 1) {
              UVar14 = this->m_ArrayIndex;
            }
            BindResourceHelper((BindResourceHelper *)&msg,this->m_Signature,this->m_ResourceCache,
                               (uint)*(ushort *)&this->m_Attribs->field_0x2,UVar14);
            local_50._M_allocated_capacity = 0;
            local_50._8_8_ = (ITexture *)0x0;
            pBufferViewVk.m_pObject = pBVar13;
            operator()((BindResourceHelper *)&msg,(BindResourceInfo *)&pBufferViewVk);
          }
        }
      }
    }
    this_00 = (string *)&pTexViewVk0;
LAB_00253c22:
    RefCntAutoPtr<Diligent::TextureViewVkImpl>::Release
              ((RefCntAutoPtr<Diligent::TextureViewVkImpl> *)this_00);
    return;
  case UniformTexelBuffer:
  case StorageTexelBuffer:
  case StorageTexelBuffer_ReadOnly:
    if (2 < (byte)(DVar1 - UniformTexelBuffer)) {
      FormatString<char[47]>(&msg,(char (*) [47])"Uniform or storage buffer resource is expected");
      in_stack_ffffffffffffff50 = (char *)0x252e02;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CacheTexelBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x1df);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        in_stack_ffffffffffffff50 = (char *)0x252e1d;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    pIVar4 = BindInfo->pObject;
    pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
    if (pIVar4 != (IDeviceObject *)0x0) {
      in_stack_ffffffffffffff50 = (char *)0x252e3f;
      (**(pIVar4->super_IObject)._vptr_IObject)(pIVar4,IID_BufferViewVk,&pBufferViewVk);
    }
    bVar8 = this->m_DstRes->Type - UniformTexelBuffer;
    if ((bVar8 < 9) && ((0x1e7U >> (bVar8 & 0x1f) & 1) != 0)) {
      uVar9 = (&DAT_006d73e4)[bVar8];
    }
    else {
      FormatString<char[44]>(&msg,(char (*) [44])"Unsupported descriptor type for buffer view");
      in_stack_ffffffffffffff50 = (char *)0x253378;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpDescriptorTypeToBufferView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0xce);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        in_stack_ffffffffffffff50 = (char *)0x253393;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      uVar9 = 0;
    }
    pBVar13 = (BufferViewVkImpl *)&msg;
    msg._M_dataplus._M_p._0_1_ = uVar9;
    ExpectedViewTypes_00._M_len = 1;
    ExpectedViewTypes_00._M_array = (iterator)0x1;
    UVar15 = 1;
    VerifyResourceViewBinding<Diligent::BufferViewVkImpl,Diligent::BUFFER_VIEW_TYPE>
              ((Diligent *)this->m_ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)pBufferViewVk.m_pObject,pBVar13,ExpectedViewTypes_00,
               RESOURCE_DIM_UNDEFINED,SUB81((this->m_DstRes->pObject).m_pObject,0),
               (IDeviceObject *)
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,in_stack_ffffffffffffff50);
    if ((this->m_ResDesc->Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) ==
        PIPELINE_RESOURCE_FLAG_NONE) {
      FormatString<char[92]>
                (&msg,(char (*) [92])
                      "FORMATTED_BUFFER resource flag is not set for a texel buffer - this should\'ve not happened."
                );
      pBVar13 = (BufferViewVkImpl *)0x1ee;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CacheTexelBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x1ee);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    ValidateBufferMode<Diligent::BufferViewVkImpl>
              (this->m_ResDesc,this->m_ArrayIndex,pBufferViewVk.m_pObject);
    UpdateCachedResource<Diligent::BufferViewVkImpl>
              (this,&pBufferViewVk,BindInfo->Flags,(Uint64)pBVar13,UVar15);
    goto LAB_00253446;
  case UniformBuffer:
  case UniformBufferDynamic:
    if (1 < (byte)(DVar1 - UniformBuffer)) {
      FormatString<char[36]>(&msg,(char (*) [36])"Uniform buffer resource is expected");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CacheUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x1af);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    pIVar4 = BindInfo->pObject;
    pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
    if (pIVar4 != (IDeviceObject *)0x0) {
      (**(pIVar4->super_IObject)._vptr_IObject)(pIVar4,IID_BufferVk,&pBufferViewVk);
    }
    pRVar2 = this->m_DstRes;
    VerifyConstantBufferBinding<Diligent::BufferVkImpl>
              (this->m_ResDesc,BindInfo,(BufferVkImpl *)pBufferViewVk.m_pObject,
               (pRVar2->pObject).m_pObject,pRVar2->BufferBaseOffset,pRVar2->BufferRangeSize,
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    RVar6 = pBufferViewVk;
    if (pBufferViewVk.m_pObject != (BufferViewVkImpl *)0x0) {
      UVar15 = BindInfo->BufferBaseOffset;
      UVar3 = BindInfo->BufferRangeSize;
      pRVar2 = this->m_DstRes;
      if ((((pRVar2->pObject).m_pObject == (IDeviceObject *)0x0) ||
          ((BindInfo->Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) !=
           SET_SHADER_RESOURCE_FLAG_NONE)) ||
         (this->m_ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) {
        pSVar5 = this->m_ResourceCache;
        pRVar12 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                  ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                               *)this->m_Signature);
        msg._M_string_length = (size_type)pBufferViewVk;
        pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
        msg._M_dataplus._M_p._4_4_ = this->m_ArrayIndex;
        msg._M_dataplus._M_p._0_4_ = (uint)*(ushort *)this->m_Attribs;
        msg.field_2._M_allocated_capacity = UVar15;
        msg.field_2._8_8_ = UVar3;
        ShaderResourceCacheVk::SetResource
                  (pSVar5,(pRVar12->m_LogicalVkDevice).
                          super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(uint)((ulong)*(undefined8 *)this->m_Attribs >> 0x3e) & 1,
                   this->m_DstResCacheOffset,(SetResourceInfo *)&msg);
        if (msg._M_string_length != 0) {
          (**(code **)(*(long *)msg._M_string_length + 0x10))();
          msg._M_string_length = 0;
        }
      }
      else {
        (**(code **)((long)((pBufferViewVk.m_pObject)->
                           super_BufferViewBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                           .super_ObjectBase<Diligent::IBufferViewVk>.
                           super_RefCountedObject<Diligent::IBufferViewVk>.super_IBufferViewVk.
                           super_IBufferView.super_IDeviceObject + 8))(pBufferViewVk.m_pObject);
        pBVar13 = (BufferViewVkImpl *)(pRVar2->pObject).m_pObject;
        (**(code **)((long)((RVar6.m_pObject)->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                           .super_ObjectBase<Diligent::IBufferViewVk>.
                           super_RefCountedObject<Diligent::IBufferViewVk>.super_IBufferViewVk.
                           super_IBufferView.super_IDeviceObject + 0x10))(RVar6.m_pObject);
        if (pBVar13 != RVar6.m_pObject) {
          FormatString<char[64]>
                    (&msg,(char (*) [64])
                          "Binding another object to a non-dynamic variable is not allowed");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"UpdateCachedResource",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                     ,0x192);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    RefCntAutoPtr<Diligent::BufferVkImpl>::Release
              ((RefCntAutoPtr<Diligent::BufferVkImpl> *)&pBufferViewVk);
    return;
  case StorageBuffer:
  case StorageBuffer_ReadOnly:
  case StorageBufferDynamic:
  case StorageBufferDynamic_ReadOnly:
    if (3 < (byte)(DVar1 - StorageBuffer)) {
      FormatString<char[36]>(&msg,(char (*) [36])"Storage buffer resource is expected");
      in_stack_ffffffffffffff50 = (char *)0x252cd0;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CacheStorageBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x1c2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        in_stack_ffffffffffffff50 = (char *)0x252ceb;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    pIVar4 = BindInfo->pObject;
    pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
    if (pIVar4 != (IDeviceObject *)0x0) {
      in_stack_ffffffffffffff50 = (char *)0x252d0d;
      (**(pIVar4->super_IObject)._vptr_IObject)(pIVar4,IID_BufferViewVk,&pBufferViewVk);
    }
    bVar8 = this->m_DstRes->Type - UniformTexelBuffer;
    if ((bVar8 < 9) && ((0x1e7U >> (bVar8 & 0x1f) & 1) != 0)) {
      uVar9 = (&DAT_006d73e4)[bVar8];
    }
    else {
      FormatString<char[44]>(&msg,(char (*) [44])"Unsupported descriptor type for buffer view");
      in_stack_ffffffffffffff50 = (char *)0x253277;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpDescriptorTypeToBufferView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0xce);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        in_stack_ffffffffffffff50 = (char *)0x253292;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      uVar9 = 0;
    }
    pBVar13 = (BufferViewVkImpl *)&msg;
    msg._M_dataplus._M_p._0_1_ = uVar9;
    ExpectedViewTypes._M_len = 1;
    ExpectedViewTypes._M_array = (iterator)0x1;
    UVar15 = 1;
    VerifyResourceViewBinding<Diligent::BufferViewVkImpl,Diligent::BUFFER_VIEW_TYPE>
              ((Diligent *)this->m_ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)pBufferViewVk.m_pObject,pBVar13,ExpectedViewTypes,
               RESOURCE_DIM_UNDEFINED,SUB81((this->m_DstRes->pObject).m_pObject,0),
               (IDeviceObject *)
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,in_stack_ffffffffffffff50);
    if ((this->m_ResDesc->Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) !=
        PIPELINE_RESOURCE_FLAG_NONE) {
      FormatString<char[90]>
                (&msg,(char (*) [90])
                      "FORMATTED_BUFFER resource flag is set for a storage buffer - this should\'ve not happened."
                );
      pBVar13 = (BufferViewVkImpl *)0x1d1;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CacheStorageBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x1d1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    ValidateBufferMode<Diligent::BufferViewVkImpl>
              (this->m_ResDesc,this->m_ArrayIndex,pBufferViewVk.m_pObject);
    UpdateCachedResource<Diligent::BufferViewVkImpl>
              (this,&pBufferViewVk,BindInfo->Flags,(Uint64)pBVar13,UVar15);
LAB_00253446:
    RefCntAutoPtr<Diligent::BufferViewVkImpl>::Release(&pBufferViewVk);
    return;
  case InputAttachment:
  case InputAttachment_General:
    if (1 < (byte)(DVar1 - InputAttachment)) {
      FormatString<char[38]>(&msg,(char (*) [38])"Input attachment resource is expected");
      in_stack_ffffffffffffff50 = (char *)0x25348b;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CacheInputAttachment",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x254);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        in_stack_ffffffffffffff50 = (char *)0x2534a6;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    pIVar4 = BindInfo->pObject;
    msg._M_dataplus._M_p = (pointer)0x0;
    if (pIVar4 != (IDeviceObject *)0x0) {
      in_stack_ffffffffffffff50 = (char *)0x2534c8;
      (**(pIVar4->super_IObject)._vptr_IObject)(pIVar4,IID_TextureViewVk,&msg);
    }
    pViewImpl_00 = (TextureViewVkImpl *)&pBufferViewVk;
    pBufferViewVk.m_pObject._0_1_ = 1;
    UVar15 = 1;
    VerifyResourceViewBinding<Diligent::TextureViewVkImpl,Diligent::TEXTURE_VIEW_TYPE>
              ((Diligent *)this->m_ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)msg._M_dataplus._M_p,pViewImpl_00,
               (initializer_list<Diligent::TEXTURE_VIEW_TYPE>)ZEXT816(1),RESOURCE_DIM_UNDEFINED,
               SUB81((this->m_DstRes->pObject).m_pObject,0),
               (IDeviceObject *)
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,in_stack_ffffffffffffff50);
    UpdateCachedResource<Diligent::TextureViewVkImpl>
              (this,(RefCntAutoPtr<Diligent::TextureViewVkImpl> *)&msg,BindInfo->Flags,
               (Uint64)pViewImpl_00,UVar15);
    this_00 = &msg;
    goto LAB_00253c22;
  case AccelerationStructure:
    pIVar4 = BindInfo->pObject;
    pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
    if (pIVar4 != (IDeviceObject *)0x0) {
      (**(pIVar4->super_IObject)._vptr_IObject)(pIVar4,IID_TopLevelASVk,&pBufferViewVk);
    }
    VerifyTLASResourceBinding<Diligent::TopLevelASVkImpl>
              (this->m_ResDesc,BindInfo,(TopLevelASVkImpl *)pBufferViewVk.m_pObject,
               (this->m_DstRes->pObject).m_pObject,
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    RVar6 = pBufferViewVk;
    if (pBufferViewVk.m_pObject != (BufferViewVkImpl *)0x0) {
      pRVar2 = this->m_DstRes;
      if ((((pRVar2->pObject).m_pObject == (IDeviceObject *)0x0) ||
          ((BindInfo->Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) !=
           SET_SHADER_RESOURCE_FLAG_NONE)) ||
         (this->m_ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) {
        pSVar5 = this->m_ResourceCache;
        pRVar12 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                  ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                               *)this->m_Signature);
        msg._M_string_length = (size_type)pBufferViewVk;
        pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
        msg._M_dataplus._M_p._4_4_ = this->m_ArrayIndex;
        msg._M_dataplus._M_p._0_4_ = (uint)*(ushort *)this->m_Attribs;
        msg.field_2._M_allocated_capacity = 0;
        msg.field_2._8_8_ = 0;
        ShaderResourceCacheVk::SetResource
                  (pSVar5,(pRVar12->m_LogicalVkDevice).
                          super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(uint)((ulong)*(undefined8 *)this->m_Attribs >> 0x3e) & 1,
                   this->m_DstResCacheOffset,(SetResourceInfo *)&msg);
        if (msg._M_string_length != 0) {
          (**(code **)(*(long *)msg._M_string_length + 0x10))();
          msg._M_string_length = 0;
        }
      }
      else {
        (**(code **)((long)((pBufferViewVk.m_pObject)->
                           super_BufferViewBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                           .super_ObjectBase<Diligent::IBufferViewVk>.
                           super_RefCountedObject<Diligent::IBufferViewVk>.super_IBufferViewVk.
                           super_IBufferView.super_IDeviceObject + 8))(pBufferViewVk.m_pObject);
        pBVar13 = (BufferViewVkImpl *)(pRVar2->pObject).m_pObject;
        (**(code **)((long)((RVar6.m_pObject)->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                           .super_ObjectBase<Diligent::IBufferViewVk>.
                           super_RefCountedObject<Diligent::IBufferViewVk>.super_IBufferViewVk.
                           super_IBufferView.super_IDeviceObject + 0x10))(RVar6.m_pObject);
        if (pBVar13 != RVar6.m_pObject) {
          FormatString<char[64]>
                    (&msg,(char (*) [64])
                          "Binding another object to a non-dynamic variable is not allowed");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"UpdateCachedResource",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                     ,0x192);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    RefCntAutoPtr<Diligent::TopLevelASVkImpl>::Release
              ((RefCntAutoPtr<Diligent::TopLevelASVkImpl> *)&pBufferViewVk);
    return;
  default:
    pBufferViewVk.m_pObject._0_4_ = (uint)pRVar2->Type;
    FormatString<char[23],unsigned_int>
              (&msg,(Diligent *)"Unknown resource type ",(char (*) [23])&pBufferViewVk,
               (uint *)pRVar2);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x176);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p != &msg.field_2) {
    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BindResourceHelper::operator()(const BindResourceInfo& BindInfo) const
{
    VERIFY_EXPR(m_ArrayIndex == BindInfo.ArrayIndex);

    if (BindInfo.pObject != nullptr)
    {
        static_assert(static_cast<Uint32>(DescriptorType::Count) == 16, "Please update the switch below to handle the new descriptor type");
        switch (m_DstRes.Type)
        {
            case DescriptorType::UniformBuffer:
            case DescriptorType::UniformBufferDynamic:
                CacheUniformBuffer(BindInfo);
                break;

            case DescriptorType::StorageBuffer:
            case DescriptorType::StorageBuffer_ReadOnly:
            case DescriptorType::StorageBufferDynamic:
            case DescriptorType::StorageBufferDynamic_ReadOnly:
                CacheStorageBuffer(BindInfo);
                break;

            case DescriptorType::UniformTexelBuffer:
            case DescriptorType::StorageTexelBuffer:
            case DescriptorType::StorageTexelBuffer_ReadOnly:
                CacheTexelBuffer(BindInfo);
                break;

            case DescriptorType::StorageImage:
            case DescriptorType::SeparateImage:
            case DescriptorType::CombinedImageSampler:
                CacheImage(BindInfo);
                break;

            case DescriptorType::Sampler:
                if (!m_Attribs.IsImmutableSamplerAssigned())
                {
                    CacheSeparateSampler(BindInfo);
                }
                else
                {
                    // Immutable samplers are permanently bound into the set layout; later binding a sampler
                    // into an immutable sampler slot in a descriptor set is not allowed (13.2.1)
                    UNEXPECTED("Attempting to assign a sampler to an immutable sampler '", m_ResDesc.Name, '\'');
                }
                break;

            case DescriptorType::InputAttachment:
            case DescriptorType::InputAttachment_General:
                CacheInputAttachment(BindInfo);
                break;

            case DescriptorType::AccelerationStructure:
                CacheAccelerationStructure(BindInfo);
                break;

            default: UNEXPECTED("Unknown resource type ", static_cast<Uint32>(m_DstRes.Type));
        }
    }
    else
    {
        DEV_CHECK_ERR((m_DstRes.pObject == nullptr ||
                       m_ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC ||
                       (BindInfo.Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) != 0),
                      "Shader variable '", m_ResDesc.Name, "' is not dynamic, but is being reset to null. This is an error and may cause unpredicted behavior. ",
                      "If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. "
                      "Otherwise, use another shader resource binding instance or label the variable as dynamic.");

        m_ResourceCache.ResetResource(m_Attribs.DescrSet, m_DstResCacheOffset);
    }
}